

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O2

void ExchCXX::mgga_screening_interface<ExchCXX::BuiltinM062X_C>::eval_exc_vxc_polar
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps,double *vrho_a,
               double *vrho_b,double *vsigma_aa,double *vsigma_ab,double *vsigma_bb,double *vlapl_a,
               double *vlapl_b,double *vtau_a,double *vtau_b)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  *eps = 0.0;
  *vrho_a = 0.0;
  *vrho_b = 0.0;
  *vsigma_aa = 0.0;
  *vsigma_ab = 0.0;
  *vsigma_bb = 0.0;
  *vlapl_a = 0.0;
  *vlapl_b = 0.0;
  *vtau_a = 0.0;
  *vtau_b = 0.0;
  if (1e-12 < rho_a + rho_b) {
    auVar2._8_8_ = rho_b;
    auVar2._0_8_ = rho_a;
    auVar2 = maxpd(_DAT_01002050,auVar2);
    auVar4._8_8_ = sigma_bb;
    auVar4._0_8_ = sigma_aa;
    auVar4 = maxpd(_DAT_01002060,auVar4);
    auVar6._8_8_ = tau_b;
    auVar6._0_8_ = tau_a;
    auVar7 = maxpd(_DAT_01002010,auVar6);
    auVar5._0_8_ = auVar2._0_8_ * 8.0 * auVar7._0_8_;
    auVar5._8_8_ = auVar2._8_8_ * 8.0 * auVar7._8_8_;
    auVar6 = minpd(auVar5,auVar4);
    dVar3 = (auVar6._8_8_ + auVar6._0_8_) * 0.5;
    uVar1 = -(ulong)(-dVar3 <= sigma_ab);
    dVar8 = (double)(uVar1 & (ulong)sigma_ab | ~uVar1 & (ulong)-dVar3);
    uVar1 = -(ulong)(dVar8 <= dVar3);
    kernel_traits<ExchCXX::BuiltinM062X_C>::eval_exc_vxc_polar_impl
              (auVar2._0_8_,auVar2._8_8_,auVar6._0_8_,
               (double)(~uVar1 & (ulong)dVar3 | uVar1 & (ulong)dVar8),auVar6._8_8_,lapl_a,lapl_b,
               auVar7._0_8_,auVar7._8_8_,eps,vrho_a,vrho_b,vsigma_aa,vsigma_ab,vsigma_bb,vlapl_a,
               vlapl_b,vtau_a,vtau_b);
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar( double rho_a, double rho_b, double sigma_aa, 
      double sigma_ab, double sigma_bb, double lapl_a, double lapl_b,
      double tau_a, double tau_b, double& eps, double& vrho_a,
      double& vrho_b, double& vsigma_aa, double& vsigma_ab, 
      double& vsigma_bb, double& vlapl_a, double& vlapl_b,
      double& vtau_a, double& vtau_b ) {

    const double rho_s = rho_a + rho_b;
    //const double rho_z = rho_a - rho_b;

    eps       = 0.;
    vrho_a    = 0.;
    vrho_b    = 0.;
    vsigma_aa = 0.;
    vsigma_ab = 0.;
    vsigma_bb = 0.;
    vlapl_a   = 0.;
    vlapl_b   = 0.;
    vtau_a    = 0.;
    vtau_b    = 0.;

    if( rho_s > traits::dens_tol ) {
      constexpr auto sigma_tol_sq = traits::sigma_tol * traits::sigma_tol;
      rho_a    = safe_max(rho_a, traits::dens_tol);
      rho_b    = safe_max(rho_b, traits::dens_tol);
      sigma_aa = safe_max(sigma_aa, sigma_tol_sq); 
      sigma_bb = safe_max(sigma_bb, sigma_tol_sq); 
      tau_a = safe_max(tau_a, traits::tau_tol);
      tau_b = safe_max(tau_b, traits::tau_tol);
      if constexpr (not traits::is_kedf) {
        sigma_aa = enforce_fermi_hole_curvature(sigma_aa, rho_a, tau_a);
        sigma_bb = enforce_fermi_hole_curvature(sigma_bb, rho_b, tau_b);
      }
      sigma_ab = enforce_polar_sigma_constraints(sigma_aa, sigma_ab, sigma_bb);

      traits::eval_exc_vxc_polar_impl( rho_a, rho_b, sigma_aa, sigma_ab, 
        sigma_bb, lapl_a, lapl_b, 
        safe_max(traits::tau_tol, tau_a), 
        safe_max(traits::tau_tol, tau_b), 
        eps, vrho_a, vrho_b, vsigma_aa, vsigma_ab, vsigma_bb, vlapl_a, vlapl_b, 
        vtau_a, vtau_b );
    }

  }